

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O2

void __thiscall Cleaner::DoCleanRule(Cleaner *this,Rule *rule)

{
  __type _Var1;
  State *pSVar2;
  Edge *pEVar3;
  pointer ppNVar4;
  pointer ppEVar5;
  
  if (rule != (Rule *)0x0) {
    pSVar2 = this->state_;
    for (ppEVar5 = (pSVar2->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppEVar5 !=
        (pSVar2->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppEVar5 = ppEVar5 + 1) {
      _Var1 = std::operator==(&(*ppEVar5)->rule_->name_,&rule->name_);
      if (_Var1) {
        pEVar3 = *ppEVar5;
        for (ppNVar4 = (pEVar3->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            ppNVar4 !=
            (pEVar3->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish; ppNVar4 = ppNVar4 + 1) {
          Remove(this,&(*ppNVar4)->path_);
          RemoveEdgeFiles(this,*ppEVar5);
          pEVar3 = *ppEVar5;
        }
      }
      pSVar2 = this->state_;
    }
    return;
  }
  __assert_fail("rule",
                "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean.cc",
                0xdf,"void Cleaner::DoCleanRule(const Rule *)");
}

Assistant:

void Cleaner::DoCleanRule(const Rule* rule) {
  assert(rule);

  for (vector<Edge*>::iterator e = state_->edges_.begin();
       e != state_->edges_.end(); ++e) {
    if ((*e)->rule().name() == rule->name()) {
      for (vector<Node*>::iterator out_node = (*e)->outputs_.begin();
           out_node != (*e)->outputs_.end(); ++out_node) {
        Remove((*out_node)->path());
        RemoveEdgeFiles(*e);
      }
    }
  }
}